

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

BOOL MAPIsRequestPermissible(DWORD flProtect,CFileProcessLocalData *pFileLocalData)

{
  uint uVar1;
  
  if ((flProtect == 2) || (flProtect == 8)) {
    if (pFileLocalData->open_flags_deviceaccessonly == 1) {
      return 0;
    }
    uVar1 = pFileLocalData->open_flags;
    if ((uVar1 & 1) != 0) {
      return 0;
    }
    if (flProtect != 4) {
      return 1;
    }
  }
  else {
    if (flProtect != 4) {
      return 1;
    }
    uVar1 = pFileLocalData->open_flags;
  }
  if ((uVar1 & 2) != 0) {
    return 1;
  }
  return 0;
}

Assistant:

static BOOL MAPIsRequestPermissible( DWORD flProtect, CFileProcessLocalData * pFileLocalData )
{
    if ( ( (flProtect == PAGE_READONLY || flProtect == PAGE_WRITECOPY) && 
           (pFileLocalData->open_flags_deviceaccessonly == TRUE || 
            pFileLocalData->open_flags & O_WRONLY) )
       )
    {
        /*
         * PAGE_READONLY or PAGE_WRITECOPY access to a file must at least be
         * readable. Contrary to what MSDN says, PAGE_WRITECOPY
         * only needs to be readable.
         */
        return FALSE;
    }
    else if ( flProtect == PAGE_READWRITE && !(pFileLocalData->open_flags & O_RDWR) )
    {
        /*
         * PAGE_READWRITE access to a file needs to be readable and writable 
         */
        return FALSE;
    }
    else
    {
        /* Action is permissible */
        return TRUE;
    }
}